

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O2

void ev_fork_stop(ev_loop *loop,ev_fork *w)

{
  int iVar1;
  int iVar2;
  int active;
  long lVar3;
  
  clear_pending(loop,(W)w);
  iVar1 = w->active;
  lVar3 = (long)iVar1;
  if (lVar3 != 0) {
    iVar2 = loop->forkcnt;
    loop->forkcnt = iVar2 + -1;
    loop->forks[lVar3 + -1] = loop->forks[(long)iVar2 + -1];
    loop->forks[lVar3 + -1]->active = iVar1;
    loop->activecnt = loop->activecnt + -1;
    w->active = 0;
  }
  return;
}

Assistant:

void
ev_fork_stop (EV_P_ ev_fork *w) EV_THROW
{
  clear_pending (EV_A_ (W)w);
  if (expect_false (!ev_is_active (w)))
    return;

  EV_FREQUENT_CHECK;

  {
    int active = ev_active (w);

    forks [active - 1] = forks [--forkcnt];
    ev_active (forks [active - 1]) = active;
  }

  ev_stop (EV_A_ (W)w);

  EV_FREQUENT_CHECK;
}